

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O2

void CB_ADF::output_example(vw *all,cb_adf *c,example *ec,multi_ex *ec_seq)

{
  v_array<char> *pvVar1;
  int iVar2;
  int *piVar3;
  wclass *pwVar4;
  wclass *pwVar5;
  _func_void_int_string_v_array<char> *p_Var6;
  v_array<char> vVar7;
  bool bVar8;
  byte bVar9;
  ostream *poVar10;
  int *piVar11;
  ulong uVar12;
  float *pfVar13;
  float fVar14;
  undefined1 in_stack_fffffffffffffde8 [15];
  string local_1f8 [32];
  string outputString;
  stringstream outputStringStream;
  ostream local_1a8;
  
  bVar8 = CB_ALGS::example_is_newline_not_header(ec);
  if (!bVar8) {
    bVar9 = update_statistics(all,c,ec,ec_seq);
    piVar3 = (all->final_prediction_sink)._end;
    fVar14 = (float)((ec->pred).a_s._begin)->action;
    pvVar1 = &ec->tag;
    for (piVar11 = (all->final_prediction_sink)._begin; piVar11 != piVar3; piVar11 = piVar11 + 1) {
      (*all->print)(*piVar11,fVar14,0.0,*pvVar1);
    }
    if (0 < all->raw_prediction) {
      outputString._M_dataplus._M_p = (pointer)&outputString.field_2;
      outputString._M_string_length = 0;
      outputString.field_2._M_local_buf[0] = '\0';
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&outputStringStream,(string *)&outputString,_S_out|_S_in);
      pwVar4 = (ec->l).cs.costs._begin;
      pwVar5 = (ec->l).cs.costs._end;
      pfVar13 = &pwVar4->wap_value;
      for (uVar12 = 0; uVar12 < (ulong)((long)pwVar5 - (long)pwVar4 >> 4); uVar12 = uVar12 + 1) {
        if (uVar12 != 0) {
          std::operator<<(&local_1a8,' ');
        }
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        poVar10 = std::operator<<(poVar10,':');
        std::ostream::operator<<(poVar10,*pfVar13);
        pfVar13 = pfVar13 + 4;
      }
      p_Var6 = all->print_text;
      iVar2 = all->raw_prediction;
      std::__cxx11::stringbuf::str();
      vVar7._end._7_1_ = bVar9;
      vVar7._0_15_ = in_stack_fffffffffffffde8;
      vVar7.end_array._0_4_ = (int)ec_seq;
      vVar7.end_array._4_4_ = (int)((ulong)ec_seq >> 0x20);
      vVar7.erase_count = (size_t)ec;
      (*p_Var6)(iVar2,(string)*pvVar1,vVar7);
      std::__cxx11::string::~string(local_1f8);
      std::__cxx11::stringstream::~stringstream((stringstream *)&outputStringStream);
      std::__cxx11::string::~string((string *)&outputString);
    }
    CB::print_update(all,(bool)(bVar9 ^ 1),ec,ec_seq,true);
  }
  return;
}

Assistant:

void output_example(vw& all, cb_adf& c, example& ec, multi_ex* ec_seq)
{
  if (example_is_newline_not_header(ec))
    return;

  bool labeled_example = update_statistics(all, c, ec, ec_seq);

  uint32_t action = ec.pred.a_s[0].action;
  for (int sink : all.final_prediction_sink) all.print(sink, (float)action, 0, ec.tag);

  if (all.raw_prediction > 0)
  {
    string outputString;
    stringstream outputStringStream(outputString);
    v_array<CB::cb_class> costs = ec.l.cb.costs;

    for (size_t i = 0; i < costs.size(); i++)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << costs[i].action << ':' << costs[i].partial_prediction;
    }
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  CB::print_update(all, !labeled_example, ec, ec_seq, true);
}